

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O1

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* __thiscall
mesh::createmat(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *__return_storage_ptr__,mesh *this,int m,int r,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *mcurrent,
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *res,int c)

{
  float fVar1;
  int iVar2;
  int iVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  undefined4 in_register_0000000c;
  uint uVar11;
  undefined4 in_register_00000014;
  ulong uVar12;
  int iVar13;
  pointer pvVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  vector<float,_std::allocator<float>_> *row;
  pointer pvVar20;
  uint local_90;
  allocator_type local_89;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_88;
  ulong local_78;
  value_type_conflict2 local_64;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  ulong local_58;
  
  local_78 = CONCAT44(in_register_00000014,m);
  local_58 = CONCAT44(in_register_0000000c,r);
  local_60 = mcurrent;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(__return_storage_ptr__,(long)m,&local_89);
  pvVar20 = (__return_storage_ptr__->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar14 = (__return_storage_ptr__->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_88 = __return_storage_ptr__;
  if (pvVar20 != pvVar14) {
    do {
      local_64 = 0.0;
      std::vector<float,_std::allocator<float>_>::resize(pvVar20,(long)m,&local_64);
      pvVar20 = pvVar20 + 1;
    } while (pvVar20 != pvVar14);
  }
  iVar13 = (int)local_58;
  local_58 = local_58 & 0xffffffff;
  if (2 < c) {
    iVar9 = 1;
    do {
      if (0 < iVar13) {
        pvVar4 = (local_60->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = 0;
        do {
          pvVar20 = (res->
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar14 = (local_88->
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar5 = *(long *)&pvVar4[uVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
          uVar16 = 0;
          do {
            if (*(int *)(lVar5 + (long)iVar9 * 4 + uVar16 * 4) == 1) {
              fVar1 = *(float *)(*(long *)&pvVar20[uVar18].
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data + uVar16 * 4);
              if ((fVar1 != 0.0) || (NAN(fVar1))) {
                lVar8 = (long)(iVar9 / iVar13);
                lVar6 = *(long *)&pvVar14[lVar8].super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data;
                *(float *)(lVar6 + lVar8 * 4) = fVar1 + *(float *)(lVar6 + lVar8 * 4);
              }
            }
            uVar16 = uVar16 + 1;
          } while (local_58 != uVar16);
          uVar18 = uVar18 + 1;
        } while (uVar18 != local_58);
      }
      iVar9 = iVar9 + iVar13 + 1;
    } while (iVar9 < c + -1);
  }
  iVar9 = (int)local_78;
  if (1 < iVar9) {
    iVar7 = iVar13 + 1;
    uVar10 = iVar13 + 2;
    uVar16 = 1;
    uVar11 = 1;
    uVar18 = 0;
    do {
      pvVar4 = (local_60->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar12 = uVar18 + 1;
      uVar17 = uVar16;
      local_90 = uVar10;
      do {
        if (0 < iVar13) {
          uVar19 = 0;
          do {
            lVar5 = *(long *)&pvVar4[uVar19].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data;
            pvVar20 = (res->
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pvVar14 = (local_88->
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar15 = uVar19;
            do {
              iVar2 = *(int *)(lVar5 + (ulong)uVar11 * 4 + uVar15 * 4);
              if ((iVar2 != 0) &&
                 (iVar3 = *(int *)(lVar5 + (ulong)local_90 * 4 + uVar15 * 4), iVar3 != 0)) {
                lVar6 = *(long *)&pvVar14[uVar18].super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data;
                *(float *)(lVar6 + uVar17 * 4) =
                     (float)(iVar3 * iVar2) *
                     *(float *)(*(long *)&pvVar20[uVar19].
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data + uVar15 * 4) +
                     *(float *)(lVar6 + uVar17 * 4);
              }
              uVar15 = uVar15 + 1;
            } while (local_58 != uVar15);
            uVar19 = uVar19 + 1;
          } while (uVar19 != local_58);
        }
        uVar17 = uVar17 + 1;
        local_90 = local_90 + iVar7;
      } while (uVar17 != (local_78 & 0xffffffff));
      uVar16 = uVar16 + 1;
      uVar10 = uVar10 + iVar7;
      uVar11 = uVar11 + iVar7;
      uVar18 = uVar12;
    } while (uVar12 != iVar9 - 1);
  }
  if (0 < iVar9) {
    pvVar20 = (local_88->
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar18 = 0;
    do {
      if (uVar18 != 0) {
        lVar5 = *(long *)&pvVar20[uVar18].super__Vector_base<float,_std::allocator<float>_>._M_impl;
        uVar16 = 0;
        pvVar14 = pvVar20;
        do {
          *(undefined4 *)(lVar5 + uVar16 * 4) =
               *(undefined4 *)
                (*(long *)&(pvVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data + uVar18 * 4);
          uVar16 = uVar16 + 1;
          pvVar14 = pvVar14 + 1;
        } while (uVar18 != uVar16);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (local_78 & 0xffffffff));
  }
  return local_88;
}

Assistant:

std::vector<std::vector<float>> createmat(int m, int r, std::vector<std::vector<int>> &mcurrent, std::vector<std::vector<float>> &res, int c)
    {

        int  k, kk, ii, jj, i, j;
        std::vector<std::vector<float>> a(m);
        for (auto &row : a)
        {
            row.resize(m, 0);
        }

        //element on the diagonal
        for(k=1; k<c-1; k=k+r+1)
        {
            for(i=0; i < r; i++)
            {
                for(j=0; j < r; j++)
                {
                    if(mcurrent[i][j+k]==1 && res[i][j]!=0)
                    {
                        a[k/r][k/r] += res[i][j];
                    }
                }
            }
        }

        //element off the diagonal
        for(i=0; i < m-1; i++) {
            for (j = i + 1; j < m; j++) {
                k = 1 + (r + 1) * i;
                kk = 1 + (r + 1) * j;
                for (ii = 0; ii < r; ii++) {
                    for (jj = ii; jj < r; jj++) {
                        if (mcurrent[ii][jj + k] != 0 && mcurrent[ii][jj + kk] != 0) {
                            a[i][j] += (mcurrent[ii][jj + k] * mcurrent[ii][jj + kk]) * res[ii][jj];
                        }
                    }
                }
            }
        }

            for(i = 0; i < m; i++)
            {
                for(j = 0; j < i; j++)
                {
                    a[i][j] = a[j][i];
                }
            }
             return a;
    }